

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O3

void __thiscall
wasm::analysis::ReachingDefinitionsTransferFunction::visitLocalGet
          (ReachingDefinitionsTransferFunction *this,LocalGet *curr)

{
  Element *pEVar1;
  ulong uVar2;
  mapped_type *pmVar3;
  array<wasm::LocalSet_*,_2UL> *paVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_00;
  ulong uVar7;
  key_type *x;
  ulong uVar8;
  long lVar9;
  LocalGet *local_78;
  LocalGet *curr_local;
  value_type setInstance;
  _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  ulong local_58;
  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  mapped_type *local_48;
  key_type local_40;
  ReachingDefinitionsTransferFunction *local_38;
  
  local_78 = curr;
  if ((this->
      super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
      ).currState == (Element *)0x0) {
    __assert_fail("currState",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/reaching-definitions-transfer-function.h"
                  ,0x78,
                  "void wasm::analysis::ReachingDefinitionsTransferFunction::visitLocalGet(LocalGet *)"
                 );
  }
  if ((this->
      super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
      ).collectingResults == true) {
    local_38 = this;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->indexSetses,&curr->index);
    setInstance = (value_type)
                  (((long)(pmVar3->flexible).
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar3->flexible).
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) + pmVar3->usedFixed);
    if (setInstance != (value_type)0x0) {
      local_60 = (_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&(local_38->lattice).memberIndices;
      local_50 = &(local_38->fakeSetPtrs)._M_h;
      lVar9 = -0x10;
      uVar8 = 0;
      local_58 = 0x800000000000003f;
      local_48 = pmVar3;
      do {
        pmVar3 = (mapped_type *)&pmVar3->fixed;
        paVar4 = (array<wasm::LocalSet_*,_2UL> *)
                 ((long)(local_48->flexible).
                        super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar9);
        if (uVar8 < 2) {
          paVar4 = (array<wasm::LocalSet_*,_2UL> *)pmVar3;
        }
        curr_local = (LocalGet *)paVar4->_M_elems[0];
        pEVar1 = (local_38->
                 super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                 ).currState;
        local_40 = (key_type)curr_local;
        pmVar5 = std::__detail::
                 _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_60,&local_40);
        uVar2 = *pmVar5;
        uVar7 = uVar2 + 0x3f;
        if (-1 < (long)uVar2) {
          uVar7 = uVar2;
        }
        if ((*(ulong *)(((long)uVar7 >> 6) * 8 +
                        *(long *)&(pEVar1->bitvector).super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start + -8 +
                       (ulong)((uVar2 & local_58) < 0x8000000000000001) * 8) >> (uVar2 & 0x3f) & 1)
            != 0) {
          iVar6 = std::
                  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(local_50,(key_type *)&curr_local);
          this_00 = &std::__detail::
                     _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_38->getSetsMap,&local_78)->
                     super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ;
          x = (key_type *)&curr_local;
          if (iVar6.super__Node_iterator_base<wasm::LocalSet_*,_false>._M_cur != (__node_type *)0x0)
          {
            local_40 = (LocalSet *)0x0;
            x = &local_40;
          }
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::insert(this_00,x);
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 8;
      } while (setInstance != (value_type)uVar8);
    }
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    assert(currState);

    // This is only to be run in the second phase where we iterate over the
    // final (i.e. solved) states. Thus, only done when collectingResults is
    // true.
    if (collectingResults) {
      auto& matchingSets = indexSetses[curr->index];

      for (auto setInstance : matchingSets) {
        if (lattice.exists(currState, setInstance)) {
          // If a pointer to a real LocalSet, add it, otherwise add a nullptr.
          if (fakeSetPtrs.find(setInstance) == fakeSetPtrs.end()) {
            getSetsMap[curr].insert(setInstance);
          } else {
            getSetsMap[curr].insert(nullptr);
          }
        }
      }
    }
  }